

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

ItemList *
Lib::UniquePersistentIterator<Lib::Stack<Kernel::Clause_*>::Iterator>::getUniqueItemList
          (Iterator *inn,size_t *sizeRef)

{
  bool bVar1;
  long *in_RSI;
  RefIterator *in_RDI;
  T el;
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  iset;
  ItemList *res;
  Clause *in_stack_ffffffffffffff98;
  Clause *in_stack_ffffffffffffffa0;
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_ffffffffffffffe0;
  ItemList *local_18;
  
  local_18 = (ItemList *)0x0;
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_ffffffffffffffa0);
  *in_RSI = 0;
  while (bVar1 = Stack<Kernel::Clause_*>::RefIterator::hasNext(in_RDI), bVar1) {
    Stack<Kernel::Clause_*>::Iterator::next((Iterator *)0x784a4a);
    Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::operator->((Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x784a65);
    bVar1 = DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      ((DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                       in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      List<Kernel::Clause_*>::push
                (in_stack_ffffffffffffffa0,(List<Kernel::Clause_*> **)in_stack_ffffffffffffff98);
      *in_RSI = *in_RSI + 1;
    }
  }
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(in_stack_ffffffffffffffe0);
  return local_18;
}

Assistant:

static ItemList* getUniqueItemList(Inner& inn, size_t& sizeRef)
  {
    ItemList* res=0;
    Recycled<ItemSet> iset;

    sizeRef=0;
    while(inn.hasNext()) {
      T el=inn.next();
      if(iset->insert(el)) {
	ItemList::push(el, res);
	sizeRef++;
      }
    }

    return res;
  }